

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall GameEngine::GameEngine(GameEngine *this)

{
  int32_t iVar1;
  Config *this_00;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  GameEngine *local_10;
  GameEngine *this_local;
  
  local_10 = this;
  std::shared_ptr<Map>::shared_ptr(&this->map);
  std::shared_ptr<Manager>::shared_ptr(&this->manager);
  std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::vector
            (&this->players);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Cat",&local_31);
  iVar1 = registerPlayer(this,&local_30);
  this->currentPlayer = iVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Bot",&local_69);
  iVar1 = registerPlayer(this,&local_68);
  this->botID = iVar1;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  this_00 = Config::getInstance();
  iVar1 = Config::getMaxStepCount(this_00);
  this->maxStep = iVar1;
  this->currentStep = 0;
  nextStep(this);
  return;
}

Assistant:

GameEngine::GameEngine() {
  currentPlayer = registerPlayer(std::string("Cat"));
  botID = registerPlayer();

  maxStep = Config::getInstance().getMaxStepCount();
  currentStep = 0;

  nextStep();
}